

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

int __thiscall
QTreeWidgetItem::clone
          (QTreeWidgetItem *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  value_type other;
  value_type pQVar1;
  QTreeWidgetItem *this_00;
  QTreeWidgetItem *t;
  QTreeWidgetItem *pQVar2;
  int i;
  int index;
  long in_FS_OFFSET;
  QArrayDataPointer<QTreeWidgetItem_*> local_78;
  QArrayDataPointer<const_QTreeWidgetItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QTreeWidgetItem **)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QTreeWidgetItem **)0x0;
  local_78.size = 0;
  QList<const_QTreeWidgetItem_*>::append((QList<const_QTreeWidgetItem_*> *)&local_58,this);
  pQVar2 = (QTreeWidgetItem *)0x0;
  QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_78,(parameter_type)0x0);
  while (local_58.size != 0) {
    other = QList<const_QTreeWidgetItem_*>::takeLast((QList<const_QTreeWidgetItem_*> *)&local_58);
    pQVar1 = QList<QTreeWidgetItem_*>::takeLast((QList<QTreeWidgetItem_*> *)&local_78);
    this_00 = (QTreeWidgetItem *)operator_new(0x60);
    QTreeWidgetItem(this_00,other);
    if (pQVar2 == (QTreeWidgetItem *)0x0) {
      pQVar2 = this_00;
    }
    if (pQVar1 != (value_type)0x0) {
      this_00->par = pQVar1;
      QList<QTreeWidgetItem_*>::insert(&pQVar1->children,0,this_00);
    }
    for (index = 0; index < (int)(other->children).d.size; index = index + 1) {
      t = child(other,index);
      QList<const_QTreeWidgetItem_*>::append((QList<const_QTreeWidgetItem_*> *)&local_58,t);
      QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_78,this_00);
    }
  }
  QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<const_QTreeWidgetItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidgetItem::clone() const
{
    QTreeWidgetItem *copy = nullptr;

    QStack<const QTreeWidgetItem*> stack;
    QStack<QTreeWidgetItem*> parentStack;
    stack.push(this);
    parentStack.push(0);

    QTreeWidgetItem *root = nullptr;
    const QTreeWidgetItem *item = nullptr;
    QTreeWidgetItem *parent = nullptr;
    while (!stack.isEmpty()) {
        // get current item, and copied parent
        item = stack.pop();
        parent = parentStack.pop();

        // copy item
        copy = new QTreeWidgetItem(*item);
        if (!root)
            root = copy;

        // set parent and add to parents children list
        if (parent) {
            copy->par = parent;
            parent->children.insert(0, copy);
        }

        for (int i = 0; i < item->childCount(); ++i) {
            stack.push(item->child(i));
            parentStack.push(copy);
        }
    }
    return root;
}